

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ysf.cpp
# Opt level: O2

void __thiscall DSDcc::DSDYSF::processVD2(DSDYSF *this,int symbolIndex,uchar dibit)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uchar bytes [12];
  
  if (symbolIndex < 0x14) {
    iVar2 = *(int *)(m_fichInterleave + (long)symbolIndex * 4);
  }
  else {
    if ((uint)symbolIndex < 0x48) {
      iVar2 = symbolIndex + -0x14;
      goto LAB_00119dc3;
    }
    if ((uint)symbolIndex < 0x5c) {
      uVar3 = (ulong)(symbolIndex - 0x34);
    }
    else {
      if ((uint)symbolIndex < 0x90) {
        iVar2 = symbolIndex + -0x5c;
        goto LAB_00119dc3;
      }
      if ((uint)symbolIndex < 0xa4) {
        uVar3 = (ulong)(symbolIndex - 0x68);
      }
      else {
        if ((uint)symbolIndex < 0xd8) {
          iVar2 = symbolIndex + -0xa4;
LAB_00119dc3:
          processVD2Voice(this,iVar2,dibit);
          return;
        }
        if (0xeb < (uint)symbolIndex) {
          if ((uint)symbolIndex < 0x120) {
            iVar2 = symbolIndex + -0xec;
          }
          else {
            if ((uint)symbolIndex < 0x134) {
              this->m_fichRaw[*(int *)(m_fichInterleave + (ulong)(symbolIndex - 0xd0) * 4)] = dibit;
              if (symbolIndex != 0x133) {
                return;
              }
              Viterbi5::decodeFromSymbols
                        (&this->m_viterbiFICH,this->m_fichGolay,this->m_fichRaw,100,0);
              bVar1 = checkCRC16(this,this->m_fichGolay,10,bytes);
              if (!bVar1) {
                return;
              }
              iVar2 = FICH::getFrameNumber(&this->m_fich);
              switch(iVar2) {
              case 0:
                *(ushort *)(this->m_dest + 8) = CONCAT11(bytes[9],bytes[8]);
                *(ulong *)this->m_dest = CONCAT44(bytes._4_4_,bytes._0_4_);
                this->m_dest[10] = '\0';
                return;
              case 1:
                *(ushort *)(this->m_src + 8) = CONCAT11(bytes[9],bytes[8]);
                *(ulong *)this->m_src = CONCAT44(bytes._4_4_,bytes._0_4_);
                this->m_src[10] = '\0';
                return;
              case 2:
                *(ushort *)(this->m_downlink + 8) = CONCAT11(bytes[9],bytes[8]);
                *(ulong *)this->m_downlink = CONCAT44(bytes._4_4_,bytes._0_4_);
                this->m_downlink[10] = '\0';
                return;
              case 3:
                *(ushort *)(this->m_uplink + 8) = CONCAT11(bytes[9],bytes[8]);
                *(ulong *)this->m_uplink = CONCAT44(bytes._4_4_,bytes._0_4_);
                this->m_uplink[10] = '\0';
                return;
              case 4:
                this->m_rem1[4] = bytes[4];
                *(undefined4 *)this->m_rem1 = bytes._0_4_;
                this->m_rem1[5] = '\0';
                *(uint *)this->m_rem2 = CONCAT13(bytes[8],bytes._5_3_);
                this->m_rem2[4] = bytes[9];
                this->m_rem2[5] = '\0';
                return;
              case 5:
                this->m_rem3[4] = bytes[4];
                *(undefined4 *)this->m_rem3 = bytes._0_4_;
                this->m_rem3[5] = '\0';
                *(uint *)this->m_rem4 = CONCAT13(bytes[8],bytes._5_3_);
                this->m_rem4[4] = bytes[9];
                this->m_rem4[5] = '\0';
                return;
              default:
                return;
              }
            }
            if (0x167 < (uint)symbolIndex) {
              return;
            }
            iVar2 = symbolIndex + -0x134;
          }
          goto LAB_00119dc3;
        }
        uVar3 = (ulong)(symbolIndex - 0x9c);
      }
    }
    iVar2 = *(int *)(m_fichInterleave + uVar3 * 4);
  }
  this->m_fichRaw[iVar2] = dibit;
  return;
}

Assistant:

void DSDYSF::processVD2(int symbolIndex, unsigned char dibit)
{
    if (symbolIndex < 20) // DCH(0) - reuse FICH buffer
    {
        m_fichRaw[m_fichInterleave[symbolIndex]] = dibit;
    }
    else if (symbolIndex < 20 + 52) // VCH(0) and VeCH(0)
    {
        processVD2Voice(symbolIndex - 20, dibit);
    }
    else if (symbolIndex < 2*20 + 52) // DCH(1)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 52]] = dibit;
    }
    else if (symbolIndex < 2*20 + 2*52) // VCH(1) and VeCH(1)
    {
        processVD2Voice(symbolIndex - (2*20 + 52), dibit);
    }
    else if (symbolIndex < 3*20 + 2*52) // DCH(2)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 2*52]] = dibit;
    }
    else if (symbolIndex < 3*20 + 3*52) // VCH(2) and VeCH(2)
    {
        processVD2Voice(symbolIndex - (3*20 + 2*52), dibit);
    }
    else if (symbolIndex < 4*20 + 3*52) // DCH(3)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 3*52]] = dibit;
    }
    else if (symbolIndex < 4*20 + 4*52) // VCH(3) and VeCH(3)
    {
        processVD2Voice(symbolIndex - (4*20 + 3*52), dibit);
    }
    else if (symbolIndex < 5*20 + 4*52) // DCH(4)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 4*52]] = dibit;

        if (symbolIndex == (5*20 + 4*52) - 1) // Final DCH
        {
            unsigned char bytes[12];

            m_viterbiFICH.decodeFromSymbols(m_fichGolay, m_fichRaw, 100, 0); // reuse FICH

            if (checkCRC16(m_fichGolay, 10, bytes))
            {
                switch (m_fich.getFrameNumber())
                {
                case 0:
                    memcpy(m_dest, bytes, 10);
                    m_dest[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2: Dest: " << m_dest << std::endl;
                    break;
                case 1:
                    memcpy(m_src, bytes, 10);
                    m_src[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2:  Src: " << m_src << std::endl;
                    break;
                case 2:
                    memcpy(m_downlink, bytes, 10);
                    m_downlink[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2:  D/L: " << m_downlink << std::endl;
                    break;
                case 3:
                    memcpy(m_uplink, bytes, 10);
                    m_uplink[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2:  U/L: " << m_uplink << std::endl;
                    break;
                case 4:
                    processCSD3_1(bytes);
                    break;
                case 5:
                    processCSD3_2(bytes);
                    break;
                default:
                    break;
                }
            }
        }
    }
    else if (symbolIndex < 5*20 + 5*52) // DCH(4)
    {
        processVD2Voice(symbolIndex - (5*20 + 4*52), dibit);
    }
}